

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha384-512.c
# Opt level: O2

void SHA384_512Finalize(SHA512Context *context,uint8_t Pad_Byte)

{
  ulong uVar1;
  ulong uVar2;
  short sVar3;
  long lVar4;
  
  lVar4 = (long)context->Message_Block_Index;
  sVar3 = context->Message_Block_Index + 1;
  context->Message_Block_Index = sVar3;
  if (lVar4 < 0x70) {
    context->Message_Block[lVar4] = Pad_Byte;
  }
  else {
    context->Message_Block[lVar4] = Pad_Byte;
    while (sVar3 < 0x80) {
      context->Message_Block_Index = sVar3 + 1;
      context->Message_Block[sVar3] = '\0';
      sVar3 = context->Message_Block_Index;
    }
    SHA384_512ProcessMessageBlock(context);
  }
  while( true ) {
    sVar3 = context->Message_Block_Index;
    if (0x6f < (long)sVar3) break;
    context->Message_Block_Index = sVar3 + 1;
    context->Message_Block[sVar3] = '\0';
  }
  uVar1 = context->Length_Low;
  uVar2 = context->Length_High;
  *(ulong *)(context->Message_Block + 0x70) =
       uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
       (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  *(ulong *)(context->Message_Block + 0x78) =
       uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
       (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
       (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  SHA384_512ProcessMessageBlock(context);
  for (lVar4 = 0; lVar4 != 0x80; lVar4 = lVar4 + 1) {
    context->Message_Block[lVar4] = '\0';
  }
  context->Length_Low = 0;
  context->Length_High = 0;
  context->Computed = 1;
  return;
}

Assistant:

static void SHA384_512Finalize(SHA512Context *context,
    uint8_t Pad_Byte)
{
    int_least16_t i;
    SHA384_512PadMessage(context, Pad_Byte);
    /* message may be sensitive, clear it out */
    for (i = 0; i < SHA512_Message_Block_Size; ++i)
        context->Message_Block[i] = 0;
#ifdef USE_32BIT_ONLY    /* and clear length */
    context->Length[0] = context->Length[1] = 0;
    context->Length[2] = context->Length[3] = 0;
#else /* !USE_32BIT_ONLY */
    context->Length_Low = 0;
    context->Length_High = 0;
#endif /* USE_32BIT_ONLY */
    context->Computed = 1;
}